

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  uVar1 = (this->u_).bits_;
  if ((~uVar1 & 0x7ff0000000000000) != 0 || (uVar1 & 0xfffffffffffff) == 0) {
    uVar3 = (rhs->u_).bits_;
    if ((~uVar3 & 0x7ff0000000000000) != 0 || (uVar3 & 0xfffffffffffff) == 0) {
      uVar2 = uVar1 | 0x8000000000000000;
      if ((long)uVar1 < 0) {
        uVar2 = -uVar1;
      }
      uVar1 = uVar3 | 0x8000000000000000;
      if ((long)uVar3 < 0) {
        uVar1 = -uVar3;
      }
      uVar3 = uVar2 - uVar1;
      if (uVar2 < uVar1) {
        uVar3 = -(uVar2 - uVar1);
      }
      bVar4 = uVar3 < 5;
      goto LAB_0016b417;
    }
  }
  bVar4 = false;
LAB_0016b417:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }